

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngunknown.c
# Opt level: O2

png_uint_32 get_unknown(display *d,png_infop info_ptr,int after_IDAT)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long in_RAX;
  char *pcVar4;
  byte *name;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  png_unknown_chunkp unknown;
  long local_38;
  
  local_38 = in_RAX;
  uVar2 = png_get_unknown_chunks(d->png_ptr,info_ptr,&local_38);
  uVar5 = (ulong)uVar2;
  uVar2 = 0;
  do {
    uVar7 = uVar5 & 0xffffffff;
    lVar6 = uVar5 * 0x20;
    while( true ) {
      uVar5 = uVar5 - 1;
      lVar6 = lVar6 + -0x20;
      if ((int)uVar7 < 1) {
        return uVar2;
      }
      name = (byte *)(local_38 + lVar6);
      uVar3 = findb(name);
      if (-1 < (int)uVar3) break;
      iVar1 = d->keep;
      if (iVar1 == 2) {
        if ((*name & 0x20) == 0) {
          fprintf(_stderr,"%s(%s): if-safe: %s: unknown critical chunk saved\n",d->file,d->test,name
                 );
          goto LAB_001031f6;
        }
      }
      else if (iVar1 != 3) {
        pcVar4 = "discard";
        if (iVar1 == 0) {
          pcVar4 = "default";
        }
        fprintf(_stderr,"%s(%s): %s: %s: unknown chunk saved\n",d->file,d->test,pcVar4,name);
LAB_001031f6:
        d->error_count = d->error_count + 1;
      }
      uVar7 = (ulong)((int)uVar7 - 1);
    }
    uVar2 = uVar2 | chunk_info[uVar3].flag;
  } while( true );
}

Assistant:

static png_uint_32
get_unknown(display *d, png_infop info_ptr, int after_IDAT)
{
   /* Create corresponding 'unknown' flags */
   png_uint_32 flags = 0;

   UNUSED(after_IDAT)

   {
      png_unknown_chunkp unknown;
      int num_unknown = png_get_unknown_chunks(d->png_ptr, info_ptr, &unknown);

      while (--num_unknown >= 0)
      {
         int chunk = findb(unknown[num_unknown].name);

         /* Chunks not known to pngunknown must be validated here; since they
          * must also be unknown to libpng the 'display->keep' behavior should
          * have been used.
          */
         if (chunk < 0) switch (d->keep)
         {
            default: /* impossible */
            case PNG_HANDLE_CHUNK_AS_DEFAULT:
            case PNG_HANDLE_CHUNK_NEVER:
               fprintf(stderr, "%s(%s): %s: %s: unknown chunk saved\n",
                  d->file, d->test, d->keep ? "discard" : "default",
                  unknown[num_unknown].name);
               ++(d->error_count);
               break;

            case PNG_HANDLE_CHUNK_IF_SAFE:
               if (!ancillaryb(unknown[num_unknown].name))
               {
                  fprintf(stderr,
                     "%s(%s): if-safe: %s: unknown critical chunk saved\n",
                     d->file, d->test, unknown[num_unknown].name);
                  ++(d->error_count);
                  break;
               }
               /* FALLTHROUGH */ /* (safe) */
            case PNG_HANDLE_CHUNK_ALWAYS:
               break;
         }

         else
            flags |= chunk_info[chunk].flag;
      }
   }

   return flags;
}